

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_updateTree(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend)

{
  uint uVar1;
  U32 UVar2;
  int in_EDX;
  long in_RDI;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 in_stack_00000078;
  U32 in_stack_0000007c;
  BYTE *in_stack_00000080;
  BYTE *in_stack_00000088;
  ZSTD_compressionParameters *in_stack_00000090;
  ZSTD_matchState_t *in_stack_00000098;
  undefined4 local_38;
  
  uVar1 = in_EDX - (int)*(undefined8 *)(in_RDI + 8);
  for (local_38 = *(uint *)(in_RDI + 0x24); local_38 < uVar1; local_38 = UVar2 + local_38) {
    UVar2 = ZSTD_insertBt1(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                           in_stack_0000007c,in_stack_00000078);
  }
  *(uint *)(in_RDI + 0x24) = uVar1;
  return;
}

Assistant:

void ZSTD_updateTree(
                ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                const BYTE* ip, const BYTE* iend)
{
    ZSTD_updateTree_internal(ms, cParams, ip, iend, cParams->searchLength, 0 /*extDict*/);
}